

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar5.c
# Opt level: O0

wchar_t dist_cache_touch(rar5 *rar,wchar_t idx)

{
  wchar_t wVar1;
  wchar_t *pwVar2;
  wchar_t local_24;
  wchar_t dist;
  wchar_t i;
  wchar_t *q;
  wchar_t idx_local;
  rar5 *rar_local;
  
  pwVar2 = (rar->cstate).dist_cache;
  wVar1 = pwVar2[idx];
  for (local_24 = idx; L'\0' < local_24; local_24 = local_24 + L'\xffffffff') {
    pwVar2[local_24] = pwVar2[local_24 + L'\xffffffff'];
  }
  *pwVar2 = wVar1;
  return wVar1;
}

Assistant:

static int dist_cache_touch(struct rar5* rar, int idx) {
	int* q = rar->cstate.dist_cache;
	int i, dist = q[idx];

	for(i = idx; i > 0; i--)
		q[i] = q[i - 1];

	q[0] = dist;
	return dist;
}